

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

IndexStack *
libcellml::rebaseIndexStack
          (IndexStack *__return_storage_ptr__,IndexStack *stack,IndexStack *originStack,
          IndexStack *destinationStack)

{
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  bool bVar1;
  size_type sVar2;
  const_iterator __last;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_68;
  const_iterator local_60;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_58;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_50;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  offsetIt;
  value_type_conflict1 local_38;
  undefined1 local_29;
  IndexStack *local_28;
  IndexStack *destinationStack_local;
  IndexStack *originStack_local;
  IndexStack *stack_local;
  IndexStack *rebasedStack;
  
  local_29 = 0;
  local_28 = destinationStack;
  destinationStack_local = originStack;
  originStack_local = stack;
  stack_local = __return_storage_ptr__;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(__return_storage_ptr__,stack);
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(destinationStack_local);
  local_38 = 0xffffffffffffffff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (__return_storage_ptr__,sVar2,&local_38);
  bVar1 = std::operator==(__return_storage_ptr__,destinationStack_local);
  if (bVar1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (__return_storage_ptr__,local_28);
    local_58._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(originStack_local);
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(destinationStack_local)
    ;
    local_50 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator+(&local_58,sVar2);
    local_68._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
    ::__normal_iterator<unsigned_long*>
              ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                *)&local_60,&local_68);
    __first._M_current = local_50._M_current;
    __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(originStack_local);
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
               local_60,__first,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )__last._M_current);
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

IndexStack rebaseIndexStack(const IndexStack &stack, const IndexStack &originStack, const IndexStack &destinationStack)
{
    auto rebasedStack = stack;

    rebasedStack.resize(originStack.size(), SIZE_MAX);
    if (rebasedStack == originStack) {
        rebasedStack = destinationStack;
        auto offsetIt = stack.begin() + ptrdiff_t(originStack.size());
        rebasedStack.insert(rebasedStack.end(), offsetIt, stack.end());
    } else {
        rebasedStack.clear();
    }

    return rebasedStack;
}